

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O1

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  SQRESULT SVar4;
  SQInteger SVar5;
  SQChar *pSVar6;
  long lVar7;
  SQInteger SVar8;
  long lVar9;
  longlong lVar10;
  size_t sVar11;
  char cVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char cVar16;
  long lVar17;
  char *pcVar18;
  SQInteger ti;
  SQFloat tf;
  SQChar *ts;
  SQChar *format;
  SQChar fmt [20];
  SQRESULT local_b0;
  char *local_a8;
  long local_a0;
  size_t local_98;
  SQFloat local_8c;
  SQChar *local_88;
  char *local_80;
  HSQUIRRELVM local_78;
  undefined8 local_70;
  char local_68 [24];
  SQInteger *local_50;
  SQChar **local_48;
  long local_40;
  long local_38;
  
  SVar4 = sq_getstring(v,nformatstringidx,(SQChar **)&local_70);
  if (-1 < SVar4) {
    local_50 = outlen;
    local_48 = output;
    SVar5 = sq_getsize(v,nformatstringidx);
    local_98 = SVar5 + 2;
    pSVar6 = sq_getscratchpad(v,local_98);
    if (0 < SVar5) {
      lVar15 = nformatstringidx + 1;
      lVar17 = 0;
      lVar13 = 0;
      local_a0 = 0;
      local_78 = v;
LAB_00172580:
      cVar12 = local_70[lVar13];
      lVar7 = 1;
      if (cVar12 == '%') {
        if (local_70[lVar13 + 1] == '%') {
          lVar7 = 2;
          cVar12 = '%';
          goto LAB_001725a0;
        }
        local_88 = pSVar6;
        SVar8 = sq_gettop(v);
        pSVar6 = local_70;
        if (SVar8 < lVar15) {
          SVar4 = sq_throwerror(v,"not enough parameters for the given format string");
          return SVar4;
        }
        lVar7 = lVar13 + 1;
        local_68[0] = '%';
        pcVar18 = local_70 + lVar13 + 2;
        lVar14 = lVar13 + 2;
        lVar13 = lVar7;
        while (((ulong)(byte)local_70[lVar13] < 0x31 &&
               ((0x1280900000000U >> ((ulong)(byte)local_70[lVar13] & 0x3f) & 1) != 0))) {
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 + 1;
          pcVar18 = pcVar18 + 1;
        }
        lVar9 = 0;
        do {
          local_38 = lVar15;
          if (9 < (int)local_70[lVar13] - 0x30U) {
            *(undefined1 *)((long)&local_a8 + lVar9) = 0;
            if (lVar9 == 0) {
              local_a0 = 0;
            }
            else {
              local_40 = lVar7;
              local_a0 = strtoll((char *)&local_a8,&local_80,10);
              lVar7 = local_40;
            }
            v = local_78;
            if (pSVar6[lVar13] != '.') goto LAB_001726e6;
            lVar15 = 0;
            goto LAB_00172688;
          }
          *(SQChar *)((long)&local_a8 + lVar9) = local_70[lVar13];
          lVar13 = lVar13 + 1;
          lVar9 = lVar9 + 1;
          lVar14 = lVar14 + 1;
          pcVar18 = pcVar18 + 1;
        } while (lVar9 != 3);
        pcVar18 = "width format too long";
        v = local_78;
        goto LAB_00172700;
      }
LAB_001725a0:
      pSVar6[lVar17] = cVar12;
      lVar17 = lVar17 + 1;
      lVar13 = lVar13 + lVar7;
      goto LAB_0017291e;
    }
    lVar17 = 0;
LAB_00172977:
    *local_50 = lVar17;
    pSVar6[lVar17] = '\0';
    *local_48 = pSVar6;
    local_b0 = 0;
    SVar4 = local_b0;
  }
  local_b0 = SVar4;
  return local_b0;
LAB_00172688:
  if ((int)*pcVar18 - 0x30U < 10) goto code_r0x00172694;
  *(undefined1 *)((long)&local_a8 + lVar15) = 0;
  lVar13 = lVar14;
  if (lVar15 != 0) {
    lVar10 = strtoll((char *)&local_a8,&local_80,10);
    local_a0 = local_a0 + lVar10;
  }
LAB_001726e6:
  lVar15 = lVar13 - lVar7;
  if (0x14 < lVar15) {
    pcVar18 = "format too long";
    goto LAB_00172700;
  }
  memcpy(local_68 + 1,pSVar6 + lVar7,lVar15 + 1);
  local_68[lVar15 + 2] = '\0';
  goto LAB_00172708;
code_r0x00172694:
  *(char *)((long)&local_a8 + lVar15) = *pcVar18;
  lVar15 = lVar15 + 1;
  lVar14 = lVar14 + 1;
  pcVar18 = pcVar18 + 1;
  if (lVar15 == 3) goto code_r0x001726a7;
  goto LAB_00172688;
code_r0x001726a7:
  pcVar18 = "precision format too long";
LAB_00172700:
  lVar13 = sq_throwerror(v,pcVar18);
LAB_00172708:
  lVar15 = local_38;
  if (lVar13 < 0) {
    return -1;
  }
  local_80 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_8c = 0.0;
  bVar1 = local_70[lVar13];
  if (bVar1 < 99) {
    if ((bVar1 == 0x45) || (bVar1 == 0x47)) goto switchD_00172759_caseD_65;
    if (bVar1 != 0x58) goto switchD_00172759_caseD_68;
switchD_00172759_caseD_64:
    sVar11 = strlen(local_68);
    cVar12 = local_68[sVar11 - 1];
    cVar16 = 'l';
    lVar7 = 0;
    do {
      local_68[lVar7 + sVar11 + -1] = cVar16;
      cVar16 = "function call"[lVar7 + 0xc];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
    local_68[sVar11 + 1] = cVar12;
    local_68[sVar11 + 2] = '\0';
switchD_00172759_caseD_63:
    SVar4 = sq_getinteger(v,lVar15,(SQInteger *)&local_a8);
    if (-1 < SVar4) {
      lVar7 = local_a0 + 0x65;
      iVar3 = 0x69;
LAB_00172817:
      local_98 = local_98 + lVar7 + 1;
      pSVar6 = sq_getscratchpad(v,local_98);
      if (iVar3 == 0x66) {
        iVar3 = snprintf(pSVar6 + lVar17,local_98,local_68,(double)local_8c);
        if (0 < iVar3) {
          iVar3 = iVar3 + 1;
          do {
            if (pSVar6[lVar17] == ',') {
              pSVar6[lVar17] = '.';
            }
            lVar17 = lVar17 + 1;
            iVar3 = iVar3 + -1;
          } while (1 < iVar3);
        }
      }
      else {
        pcVar18 = local_a8;
        if ((iVar3 == 0x69) || (pcVar18 = local_80, iVar3 == 0x73)) {
          iVar3 = snprintf(pSVar6 + lVar17,local_98,local_68,pcVar18);
          lVar17 = lVar17 + iVar3;
        }
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 1;
      bVar2 = true;
      goto LAB_00172916;
    }
    pcVar18 = "integer expected for the specified format";
  }
  else {
    switch(bVar1) {
    case 99:
      goto switchD_00172759_caseD_63;
    case 100:
    case 0x69:
    case 0x6f:
    case 0x75:
    case 0x78:
      goto switchD_00172759_caseD_64;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_00172759_caseD_65:
      SVar4 = sq_getfloat(v,local_38,&local_8c);
      if (SVar4 < 0) {
        pcVar18 = "float expected for the specified format";
        break;
      }
      lVar7 = local_a0 + 0x65;
      iVar3 = 0x66;
      goto LAB_00172817;
    default:
switchD_00172759_caseD_68:
      pcVar18 = "invalid format";
      break;
    case 0x73:
      SVar4 = sq_getstring(v,local_38,&local_80);
      if (-1 < SVar4) {
        SVar8 = sq_getsize(v,lVar15);
        lVar7 = SVar8 + local_a0 + 1;
        iVar3 = 0x73;
        goto LAB_00172817;
      }
      pcVar18 = "string expected for the specified format";
    }
  }
  local_b0 = sq_throwerror(v,pcVar18);
  bVar2 = false;
  pSVar6 = local_88;
LAB_00172916:
  if (!bVar2) {
    return local_b0;
  }
LAB_0017291e:
  if (SVar5 <= lVar13) goto LAB_00172977;
  goto LAB_00172580;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = strlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': {
                int len = scsprintf(&dest[i], allocated, fmt, tf);
                for (; len > 0; len--, i++)
                    if (dest[i] == ',')
                        dest[i] = '.';
                break;
                }
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}